

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

ON_NurbsCurve * ToCurve(ON_NurbsSurface *srf,int dir,ON_NurbsCurve *crv)

{
  bool bVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  double *local_50;
  
  if (srf->m_cv != (double *)0x0) {
    if (crv == (ON_NurbsCurve *)0x0) {
      crv = (ON_NurbsCurve *)operator_new(0x40);
      ON_NurbsCurve::ON_NurbsCurve(crv);
    }
    lVar8 = ((long)srf->m_dim + 1) - (ulong)(srf->m_is_rat == 0);
    uVar4 = 1 - dir;
    bVar1 = ON_NurbsCurve::Create
                      (crv,srf->m_cv_count[uVar4] * (int)lVar8,false,srf->m_order[(uint)dir],
                       srf->m_cv_count[(uint)dir]);
    if (bVar1) {
      iVar5 = 0;
      if (crv->m_cv == srf->m_cv) {
        local_50 = (double *)onmalloc((long)crv->m_cv_stride * (long)crv->m_dim * 8);
        crv->m_cv = local_50;
      }
      else {
        local_50 = (double *)0x0;
      }
      for (; iVar5 < srf->m_cv_count[(uint)dir]; iVar5 = iVar5 + 1) {
        pdVar2 = ON_NurbsCurve::CV(crv,iVar5);
        uVar3 = srf->m_cv_stride[dir != 0] * iVar5;
        pdVar7 = (double *)0x0;
        pdVar6 = srf->m_cv + uVar3;
        if ((int)uVar3 < 0) {
          pdVar6 = pdVar7;
        }
        if (srf->m_cv == (double *)0x0) {
          pdVar6 = (double *)0x0;
        }
        for (; (int)pdVar7 < srf->m_cv_count[uVar4]; pdVar7 = (double *)(ulong)((int)pdVar7 + 1)) {
          memcpy(pdVar2,pdVar6,lVar8 * 8);
          pdVar6 = pdVar6 + srf->m_cv_stride[uVar4];
          pdVar2 = pdVar2 + lVar8;
        }
      }
      if (local_50 != (double *)0x0) {
        pdVar6 = srf->m_cv;
        crv->m_cv = pdVar6;
        memcpy(pdVar6,local_50,(long)crv->m_cv_stride * (long)crv->m_dim * 8);
        onfree(local_50);
      }
      pdVar6 = crv->m_knot;
      pdVar2 = srf->m_knot[(uint)dir];
      if (pdVar6 == pdVar2) {
        return crv;
      }
      iVar5 = ON_NurbsCurve::KnotCount(crv);
      memcpy(pdVar6,pdVar2,(long)iVar5 << 3);
      return crv;
    }
  }
  return (ON_NurbsCurve *)0x0;
}

Assistant:

static ON_NurbsCurve* ToCurve( const ON_NurbsSurface& srf, int dir, 
                               ON_NurbsCurve* crv )
{
  double* tmp_cv = nullptr;
  if ( dir < 0 || dir > 1 )
    return nullptr;
  if ( !srf.m_cv )
    return nullptr;
  if ( !crv )
    crv = new ON_NurbsCurve();
  int srf_cv_size = srf.CVSize();
  if ( !crv->Create(
          srf_cv_size*srf.m_cv_count[1-dir], // dim
          false, // is_rat
          srf.m_order[dir],
          srf.m_cv_count[dir]
          ) )
    return nullptr;
  if ( crv->m_cv == srf.m_cv )
  {
    tmp_cv = (double*)onmalloc( crv->m_dim*crv->m_cv_stride*sizeof(tmp_cv[0]) );
    crv->m_cv = tmp_cv;
  }
  double* pdst;
  const double* psrc;
  int i, j;
  size_t sz = srf_cv_size*sizeof(pdst[0]);
  for ( i = 0; i < srf.m_cv_count[dir]; i++ )
  {
    pdst = crv->CV(i);
    psrc = dir ? srf.CV(0,i) : srf.CV(i,0);
    for ( j = 0; j < srf.m_cv_count[1-dir]; j++ )
    {
      memcpy( pdst, psrc, sz );
      psrc += srf.m_cv_stride[1-dir];
      pdst += srf_cv_size;
    }
  }
  if ( tmp_cv )
  {
    crv->m_cv = srf.m_cv;
    memcpy( crv->m_cv, tmp_cv, crv->m_dim*crv->m_cv_stride*sizeof(tmp_cv[0]) );
    onfree(tmp_cv);
  }
  if ( crv->m_knot != srf.m_knot[dir] )
    memcpy( crv->m_knot, srf.m_knot[dir], crv->KnotCount()*sizeof(crv->m_knot[0]) );
  return crv;
}